

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.cpp
# Opt level: O2

void __thiscall ixy::IxgbeDevice::init_link(IxgbeDevice *this)

{
  uint32_t uVar1;
  
  uVar1 = get_reg32(this,0x42a0);
  set_reg32(this,0x42a0,(uVar1 & 0xffff1fff) + 0x6000);
  uVar1 = get_reg32(this,0x42a0);
  set_reg32(this,0x42a0,uVar1 & 0xfffffe7f);
  set_flags32(this,0x42a0,0x1000);
  return;
}

Assistant:

void IxgbeDevice::init_link() {
    // should already be set by the eeprom config, maybe we shouldn't override it here to support weirdo nics?
    set_reg32(IXGBE_AUTOC, (get_reg32(IXGBE_AUTOC) & ~IXGBE_AUTOC_LMS_MASK) | IXGBE_AUTOC_LMS_10G_SERIAL);
    set_reg32(IXGBE_AUTOC, (get_reg32(IXGBE_AUTOC) & ~IXGBE_AUTOC_10G_PMA_PMD_MASK) | IXGBE_AUTOC_10G_XAUI);
    // negotiate link
    set_flags32(IXGBE_AUTOC, IXGBE_AUTOC_AN_RESTART);
    // datasheet wants us to wait for the link here, but we can continue and wait afterwards
}